

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextobject.cpp
# Opt level: O0

int __thiscall QTextFragment::length(QTextFragment *this)

{
  uint uVar1;
  QFragmentMap<QTextFragmentData> *in_RDI;
  int f;
  int len;
  uint in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffdc;
  uint local_18;
  int local_14;
  int local_4;
  
  if (((in_RDI->data).field_0.head == (Header *)0x0) || (*(int *)&in_RDI[1].data.field_0 == 0)) {
    local_4 = 0;
  }
  else {
    local_14 = 0;
    local_18 = *(uint *)&in_RDI[1].data.field_0;
    while (local_18 != *(uint *)((long)&in_RDI[1].data.field_0 + 4)) {
      QTextDocumentPrivate::fragmentMap((QTextDocumentPrivate *)(in_RDI->data).field_0.head);
      uVar1 = QFragmentMap<QTextFragmentData>::size
                        (in_RDI,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
      local_14 = uVar1 + local_14;
      QTextDocumentPrivate::fragmentMap((QTextDocumentPrivate *)(in_RDI->data).field_0.head);
      local_18 = QFragmentMap<QTextFragmentData>::next(in_RDI,in_stack_ffffffffffffffdc);
    }
    local_4 = local_14;
  }
  return local_4;
}

Assistant:

int QTextFragment::length() const
{
    if (!p || !n)
        return 0;

    int len = 0;
    int f = n;
    while (f != ne) {
        len += p->fragmentMap().size(f);
        f = p->fragmentMap().next(f);
    }
    return len;
}